

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O3

void __thiscall
visitor_test_should_parse_utc_date_Test::TestBody(visitor_test_should_parse_utc_date_Test *this)

{
  char **this_00;
  bool bVar1;
  char *pcVar2;
  time_t local_70;
  time_t t;
  tm tm;
  AssertionResult gtest_ar;
  Message local_18;
  
  local_70 = (time_t)Fixpp::details::LexicalCast<Fixpp::Type::UTCDate>::cast("20171105",8);
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_hour = 0;
  tm.tm_mday = 0;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  t = 0;
  tm.tm_sec = 0;
  tm.tm_min = 0;
  tm.tm_gmtoff = 0;
  gmtime_r(&local_70,(tm *)&t);
  local_18.ss_.ptr_._0_4_ = 0x75;
  this_00 = &tm.tm_zone;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)this_00,"tm.tm_year","117",&tm.tm_mday,(int *)&local_18);
  if ((char)tm.tm_zone == '\0') {
    testing::Message::Message(&local_18);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x247,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_18.ss_.ptr_._0_4_ = 10;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)this_00,"tm.tm_mon","10",&tm.tm_hour,(int *)&local_18);
    if ((char)tm.tm_zone == '\0') {
      testing::Message::Message(&local_18);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x248,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      if (CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_18.ss_.ptr_._0_4_ = 5;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)this_00,"tm.tm_mday","5",&tm.tm_min,(int *)&local_18);
      if ((char)tm.tm_zone == '\0') {
        testing::Message::Message(&local_18);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                   ,0x249,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_18);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
        if (CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) != 0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) &&
             ((long *)CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_18.ss_.ptr_._0_4_ = 0;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)this_00,"tm.tm_hour","0",&tm.tm_sec,(int *)&local_18);
        if ((char)tm.tm_zone == '\0') {
          testing::Message::Message(&local_18);
          if (gtest_ar._0_8_ == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                     ,0x24a,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_18);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
          if (CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) != 0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               ((long *)CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) != (long *)0x0)) {
              (**(code **)(*(long *)CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) + 8))
                        ();
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_18.ss_.ptr_._0_4_ = 0;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)this_00,"tm.tm_min","0",(int *)((long)&t + 4),(int *)&local_18);
          if ((char)tm.tm_zone == '\0') {
            testing::Message::Message(&local_18);
            if (gtest_ar._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                       ,0x24b,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_18)
            ;
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
            if (CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) != 0) {
              bVar1 = testing::internal::IsTrue(true);
              if ((bVar1) &&
                 ((long *)CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) != (long *)0x0))
              {
                (**(code **)(*(long *)CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) + 8)
                )();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_18.ss_.ptr_._0_4_ = 0;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)this_00,"tm.tm_sec","0",(int *)&t,(int *)&local_18);
            if ((char)tm.tm_zone == '\0') {
              testing::Message::Message(&local_18);
              if (gtest_ar._0_8_ == 0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                         ,0x24c,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar.message_,&local_18);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
              if (CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) != 0) {
                bVar1 = testing::internal::IsTrue(true);
                if ((bVar1) &&
                   ((long *)CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) != (long *)0x0
                   )) {
                  (**(code **)(*(long *)CONCAT44(local_18.ss_.ptr_._4_4_,local_18.ss_.ptr_._0_4_) +
                              8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(visitor_test, should_parse_utc_date)
{
    const char* str = "20171105";
    auto time = Fixpp::details::LexicalCast<Fixpp::Type::UTCDate>::cast(str, std::strlen(str));

    auto t = time.time();
    std::tm tm{};
    gmtime_r(&t, &tm);

    ASSERT_EQ(tm.tm_year, 117);
    ASSERT_EQ(tm.tm_mon, 10);
    ASSERT_EQ(tm.tm_mday, 5);
    ASSERT_EQ(tm.tm_hour, 0);
    ASSERT_EQ(tm.tm_min, 0);
    ASSERT_EQ(tm.tm_sec, 0);
}